

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O1

void __thiscall bloaty::CustomDataSource::MergeFrom(CustomDataSource *this,CustomDataSource *from)

{
  uint uVar1;
  void *pvVar2;
  string *psVar3;
  string *psVar4;
  LogMessage *other;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/build_O1/src/bloaty.pb.cc"
               ,0x480);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_58,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_59,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<bloaty::Regex>::TypeHandler>
            (&(this->rewrite_).super_RepeatedPtrFieldBase,
             &(from->rewrite_).super_RepeatedPtrFieldBase);
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      psVar3 = (from->name_).ptr_;
      psVar4 = (this->name_).ptr_;
      if (psVar4 != psVar3) {
        if (psVar4 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->name_,psVar3);
        }
        else {
          std::__cxx11::string::_M_assign((string *)psVar4);
        }
      }
    }
    if ((uVar1 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      psVar3 = (from->base_data_source_).ptr_;
      psVar4 = (this->base_data_source_).ptr_;
      if (psVar4 != psVar3) {
        if (psVar4 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (&this->base_data_source_,psVar3);
        }
        else {
          std::__cxx11::string::_M_assign((string *)psVar4);
        }
      }
    }
  }
  return;
}

Assistant:

void CustomDataSource::MergeFrom(const CustomDataSource& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:bloaty.CustomDataSource)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  rewrite_.MergeFrom(from.rewrite_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _has_bits_[0] |= 0x00000001u;
      name_.AssignWithDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from.name_);
    }
    if (cached_has_bits & 0x00000002u) {
      _has_bits_[0] |= 0x00000002u;
      base_data_source_.AssignWithDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from.base_data_source_);
    }
  }
}